

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

N_Vector N_VNewEmpty(SUNContext sunctx)

{
  N_Vector_Ops p_Var1;
  SUNContext in_RDI;
  N_Vector_Ops ops;
  N_Vector v;
  SUNContext sunctx_local_scope_;
  N_Vector local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else {
    local_8 = (N_Vector)malloc(0x18);
    p_Var1 = (N_Vector_Ops)malloc(0x1c0);
    p_Var1->nvgetvectorid = (_func_N_Vector_ID_N_Vector *)0x0;
    p_Var1->nvclone = (_func_N_Vector_N_Vector *)0x0;
    p_Var1->nvcloneempty = (_func_N_Vector_N_Vector *)0x0;
    p_Var1->nvdestroy = (_func_void_N_Vector *)0x0;
    p_Var1->nvspace = (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0;
    p_Var1->nvgetarraypointer = (_func_sunrealtype_ptr_N_Vector *)0x0;
    p_Var1->nvgetdevicearraypointer = (_func_sunrealtype_ptr_N_Vector *)0x0;
    p_Var1->nvsetarraypointer = (_func_void_sunrealtype_ptr_N_Vector *)0x0;
    p_Var1->nvgetcommunicator = (_func_SUNComm_N_Vector *)0x0;
    p_Var1->nvgetlength = (_func_sunindextype_N_Vector *)0x0;
    p_Var1->nvlinearsum = (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvconst = (_func_void_sunrealtype_N_Vector *)0x0;
    p_Var1->nvprod = (_func_void_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvdiv = (_func_void_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvscale = (_func_void_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvabs = (_func_void_N_Vector_N_Vector *)0x0;
    p_Var1->nvinv = (_func_void_N_Vector_N_Vector *)0x0;
    p_Var1->nvaddconst = (_func_void_N_Vector_sunrealtype_N_Vector *)0x0;
    p_Var1->nvdotprod = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvmaxnorm = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvwrmsnorm = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvwrmsnormmask = (_func_sunrealtype_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvmin = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvwl2norm = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvl1norm = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvcompare = (_func_void_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvinvtest = (_func_int_N_Vector_N_Vector *)0x0;
    p_Var1->nvconstrmask = (_func_int_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvminquotient = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvlinearcombination = (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *)0x0;
    p_Var1->nvscaleaddmulti =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvdotprodmulti = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvlinearsumvectorarray =
         (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvscalevectorarray =
         (_func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvconstvectorarray = (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr *)0x0;
    p_Var1->nvwrmsnormvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvwrmsnormmaskvectorarray =
         (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_N_Vector_sunrealtype_ptr *)0x0;
    p_Var1->nvscaleaddmultivectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)
         0x0;
    p_Var1->nvlinearcombinationvectorarray =
         (_func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
    p_Var1->nvgetlocallength = (_func_sunindextype_N_Vector *)0x0;
    p_Var1->nvdotprodlocal = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvmaxnormlocal = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvminlocal = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvl1normlocal = (_func_sunrealtype_N_Vector *)0x0;
    p_Var1->nvinvtestlocal = (_func_int_N_Vector_N_Vector *)0x0;
    p_Var1->nvconstrmasklocal = (_func_int_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvminquotientlocal = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvwsqrsumlocal = (_func_sunrealtype_N_Vector_N_Vector *)0x0;
    p_Var1->nvwsqrsummasklocal = (_func_sunrealtype_N_Vector_N_Vector_N_Vector *)0x0;
    p_Var1->nvdotprodmultilocal = (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0;
    p_Var1->nvdotprodmultiallreduce = (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0;
    p_Var1->nvbufsize = (_func_SUNErrCode_N_Vector_sunindextype_ptr *)0x0;
    p_Var1->nvbufpack = (_func_SUNErrCode_N_Vector_void_ptr *)0x0;
    p_Var1->nvbufunpack = (_func_SUNErrCode_N_Vector_void_ptr *)0x0;
    p_Var1->nvprint = (_func_void_N_Vector *)0x0;
    p_Var1->nvprintfile = (_func_void_N_Vector_FILE_ptr *)0x0;
    local_8->ops = p_Var1;
    local_8->content = (void *)0x0;
    local_8->sunctx = in_RDI;
  }
  return local_8;
}

Assistant:

N_Vector N_VNewEmpty(SUNContext sunctx)
{
  if (sunctx == NULL) { return NULL; }

  SUNFunctionBegin(sunctx);
  N_Vector v;
  N_Vector_Ops ops;

  /* create vector object */
  v = NULL;
  v = (N_Vector)malloc(sizeof *v);
  SUNAssertNull(v, SUN_ERR_MALLOC_FAIL);

  /* create vector ops structure */
  ops = NULL;
  ops = (N_Vector_Ops)malloc(sizeof *ops);
  SUNAssertNull(ops, SUN_ERR_MALLOC_FAIL);

  /* initialize operations to NULL */

  /*
   * REQUIRED operations.
   *
   * These must be implemented by derivations of the generic N_Vector.
   */

  /* constructors, destructors, and utility operations */
  ops->nvgetvectorid           = NULL;
  ops->nvclone                 = NULL;
  ops->nvcloneempty            = NULL;
  ops->nvdestroy               = NULL;
  ops->nvspace                 = NULL;
  ops->nvgetarraypointer       = NULL;
  ops->nvgetdevicearraypointer = NULL;
  ops->nvsetarraypointer       = NULL;
  ops->nvgetcommunicator       = NULL;
  ops->nvgetlength             = NULL;

  /* standard vector operations */
  ops->nvlinearsum    = NULL;
  ops->nvconst        = NULL;
  ops->nvprod         = NULL;
  ops->nvdiv          = NULL;
  ops->nvscale        = NULL;
  ops->nvabs          = NULL;
  ops->nvinv          = NULL;
  ops->nvaddconst     = NULL;
  ops->nvdotprod      = NULL;
  ops->nvmaxnorm      = NULL;
  ops->nvwrmsnorm     = NULL;
  ops->nvwrmsnormmask = NULL;
  ops->nvmin          = NULL;
  ops->nvwl2norm      = NULL;
  ops->nvl1norm       = NULL;
  ops->nvcompare      = NULL;
  ops->nvinvtest      = NULL;
  ops->nvconstrmask   = NULL;
  ops->nvminquotient  = NULL;

  /*
   * OPTIONAL operations.
   *
   * These operations provide default implementations that may be overriden.
   */

  /* fused vector operations (optional) */
  ops->nvlinearcombination = NULL;
  ops->nvscaleaddmulti     = NULL;
  ops->nvdotprodmulti      = NULL;

  /* vector array operations (optional) */
  ops->nvlinearsumvectorarray         = NULL;
  ops->nvscalevectorarray             = NULL;
  ops->nvconstvectorarray             = NULL;
  ops->nvwrmsnormvectorarray          = NULL;
  ops->nvwrmsnormmaskvectorarray      = NULL;
  ops->nvscaleaddmultivectorarray     = NULL;
  ops->nvlinearcombinationvectorarray = NULL;

  /*
   * OPTIONAL operations with no default implementation.
   */

  ops->nvgetlocallength = NULL;

  /* local reduction operations (optional) */
  ops->nvdotprodlocal     = NULL;
  ops->nvmaxnormlocal     = NULL;
  ops->nvminlocal         = NULL;
  ops->nvl1normlocal      = NULL;
  ops->nvinvtestlocal     = NULL;
  ops->nvconstrmasklocal  = NULL;
  ops->nvminquotientlocal = NULL;
  ops->nvwsqrsumlocal     = NULL;
  ops->nvwsqrsummasklocal = NULL;

  /* single buffer reduction operations */
  ops->nvdotprodmultilocal     = NULL;
  ops->nvdotprodmultiallreduce = NULL;

  /* XBraid interface operations */
  ops->nvbufsize   = NULL;
  ops->nvbufpack   = NULL;
  ops->nvbufunpack = NULL;

  /* debugging functions */
  ops->nvprint     = NULL;
  ops->nvprintfile = NULL;

  /* attach ops */
  v->ops = ops;

  /* initialize content and sunctx to NULL */
  v->content = NULL;
  v->sunctx  = sunctx;

  return v;
}